

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O0

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  byte bVar1;
  global_State *pgVar2;
  GCObject *o;
  GCObject *pGVar3;
  int deadmask;
  global_State *g;
  GCObject *curr;
  lu_mem count_local;
  GCObject **p_local;
  lua_State *L_local;
  
  pgVar2 = L->l_G;
  bVar1 = pgVar2->currentwhite;
  curr = (GCObject *)count;
  count_local = (lu_mem)p;
  while( true ) {
    pGVar3 = curr;
    o = *(GCObject **)count_local;
    if (o != (GCObject *)0x0) {
      curr = (GCObject *)((long)curr + -1);
    }
    if (o == (GCObject *)0x0 || pGVar3 == (GCObject *)0x0) break;
    if ((o->gch).tt == '\b') {
      sweeplist(L,&(o->th).openupval,0xfffffffffffffffd);
    }
    if ((byte)(((o->gch).marked ^ 3) & (bVar1 ^ 3)) == 0) {
      *(GCObject **)count_local = (o->gch).next;
      if (o == pgVar2->rootgc) {
        pgVar2->rootgc = (o->gch).next;
      }
      freeobj(L,o);
    }
    else {
      (o->gch).marked = (o->gch).marked & 0xf8 | pgVar2->currentwhite & 3;
      count_local = (lu_mem)o;
    }
  }
  return (GCObject **)count_local;
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, lu_mem count) {
  GCObject *curr;
  global_State *g = G(L);
  int deadmask = otherwhite(g);
  while ((curr = *p) != NULL && count-- > 0) {
    if (curr->gch.tt == LUA_TTHREAD)  /* sweep open upvalues of each thread */
      sweepwholelist(L, &gco2th(curr)->openupval);
    if ((curr->gch.marked ^ WHITEBITS) & deadmask) {  /* not dead? */
      lua_assert(!isdead(g, curr) || testbit(curr->gch.marked, FIXEDBIT));
      makewhite(g, curr);  /* make it white (for next cycle) */
      p = &curr->gch.next;
    }
    else {  /* must erase `curr' */
      lua_assert(isdead(g, curr) || deadmask == bitmask(SFIXEDBIT));
      *p = curr->gch.next;
      if (curr == g->rootgc)  /* is the first element of the list? */
        g->rootgc = curr->gch.next;  /* adjust first */
      freeobj(L, curr);
    }
  }
  return p;
}